

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O3

int Abc_CutVolumeCheck_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  uint uVar3;
  int iVar4;
  int in_EDX;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  int *piVar6;
  Abc_Ntk_t *pAVar7;
  int iVar8;
  
  pAVar7 = pObj->pNtk;
  uVar3 = pObj->Id;
  Vec_IntFillExtra(&pAVar7->vTravIds,uVar3 + 1,in_EDX);
  if (-1 < (int)uVar3) {
    piVar6 = &pObj->Id;
    iVar8 = 0;
    uVar5 = extraout_RDX;
    do {
      if ((pAVar7->vTravIds).nSize <= (int)uVar3) break;
      pAVar2 = pObj->pNtk;
      iVar1 = pAVar2->nTravIds;
      if ((pAVar7->vTravIds).pArray[uVar3] == iVar1) {
        return iVar8;
      }
      iVar4 = *piVar6;
      Vec_IntFillExtra(&pAVar2->vTravIds,iVar4 + 1,(int)uVar5);
      if (((long)iVar4 < 0) || ((pAVar2->vTravIds).nSize <= iVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar2->vTravIds).pArray[iVar4] = iVar1;
      uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
      if ((uVar3 == 5) || (uVar3 == 2)) {
        puts("Abc_CutVolumeCheck() ERROR: The set of nodes is not a cut!");
      }
      iVar4 = Abc_CutVolumeCheck_rec
                        ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]);
      iVar1 = (pObj->vFanins).pArray[1];
      pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[iVar1];
      iVar8 = iVar8 + 1 + iVar4;
      pAVar7 = pObj->pNtk;
      piVar6 = &pObj->Id;
      uVar3 = pObj->Id;
      Vec_IntFillExtra(&pAVar7->vTravIds,uVar3 + 1,iVar1);
      uVar5 = extraout_RDX_00;
    } while (-1 < (int)uVar3);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Abc_CutVolumeCheck_rec( Abc_Obj_t * pObj )
{
    // quit if the node is visited (or if it is a leaf)
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 0;
    Abc_NodeSetTravIdCurrent(pObj);
    // report the error
    if ( Abc_ObjIsCi(pObj) )
        printf( "Abc_CutVolumeCheck() ERROR: The set of nodes is not a cut!\n" );
    // count the number of nodes in the leaves
    return 1 + Abc_CutVolumeCheck_rec( Abc_ObjFanin0(pObj) ) +
        Abc_CutVolumeCheck_rec( Abc_ObjFanin1(pObj) );
}